

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

void window_OpenGL_init(bov_window_t *window)

{
  GLuint GVar1;
  int iVar2;
  GLint local_17c;
  GLchar *local_178;
  GLint local_16c;
  GLchar *local_168;
  GLint local_15c;
  GLchar *local_158;
  GLint local_14c;
  GLchar *local_148;
  GLint local_13c;
  GLchar *local_138;
  GLint local_12c;
  GLchar *local_128;
  GLint local_11c;
  GLchar *local_118;
  GLint local_10c;
  GLchar *local_108;
  GLint local_fc;
  GLchar *local_f8;
  GLint local_ec;
  GLchar *local_e8;
  GLuint local_dc;
  GLuint local_d8;
  GLuint defaultFS;
  GLuint defaultVS;
  GLuint trianglesFS;
  GLuint trianglesGS;
  GLuint linesFS;
  GLuint pointsFS;
  GLuint curveGS;
  GLuint linesGS;
  GLuint pointsGS;
  GLuint pointsVS;
  GLint local_a4;
  GLchar *local_a0;
  GLuint local_98;
  GLuint local_94;
  GLuint fontFS;
  GLuint fontVS;
  bov_window_t *local_10;
  bov_window_t *window_local;
  
  local_10 = window;
  (*glad_glGenBuffers)(2,window->ubo);
  (*glad_glBindBuffer)(0x8a11,local_10->ubo[0]);
  (*glad_glBufferData)(0x8a11,0x14,(void *)0x0,0x88e4);
  (*glad_glBindBufferRange)(0x8a11,0,local_10->ubo[0],0,0x14);
  (*glad_glBindBuffer)(0x8a11,local_10->ubo[1]);
  (*glad_glBufferData)(0x8a11,0x40,(void *)0x0,0x88e8);
  (*glad_glBindBufferRange)(0x8a11,1,local_10->ubo[1],0,0x40);
  (*glad_glBindBuffer)(0x8a11,0);
  local_a0 = text_vert;
  local_a4 = 0xa42;
  local_94 = LoadShader(1,&local_a0,&local_a4,"text_vert.glsl",0x8b31);
  if (local_94 != 0) {
    _pointsVS = text_frag;
    pointsGS = 0xa1c;
    local_98 = LoadShader(1,(GLchar **)&pointsVS,(GLint *)&pointsGS,"text_frag.glsl",0x8b30);
    if (local_98 != 0) {
      GVar1 = (*glad_glCreateProgram)();
      local_10->program[0] = GVar1;
      (*glad_glBindAttribLocation)(local_10->program[0],0,"pos");
      (*glad_glBindAttribLocation)(local_10->program[0],1,"tex");
      iVar2 = program_init(local_10,0,2,(ulong)local_94,(ulong)local_98);
      if (iVar2 == 0) {
        (*glad_glDetachShader)(local_10->program[0],local_94);
        (*glad_glDetachShader)(local_10->program[0],local_98);
        (*glad_glDeleteShader)(local_94);
        (*glad_glDeleteShader)(local_98);
        local_e8 = points_vert;
        local_ec = 0x51;
        linesGS = LoadShader(1,&local_e8,&local_ec,"points_vert.glsl",0x8b31);
        if (linesGS != 0) {
          local_f8 = points_geom;
          local_fc = 0xd11;
          curveGS = LoadShader(1,&local_f8,&local_fc,"points_geom.glsl",0x8dd9);
          if (curveGS != 0) {
            local_108 = lines_geom;
            local_10c = 0xd7f;
            pointsFS = LoadShader(1,&local_108,&local_10c,"lines_geom.glsl",0x8dd9);
            if (pointsFS != 0) {
              local_118 = curve_geom;
              local_11c = 0x1672;
              linesFS = LoadShader(1,&local_118,&local_11c,"curve_geom.glsl",0x8dd9);
              if (linesFS != 0) {
                local_128 = triangles_geom;
                local_12c = 0xf87;
                defaultVS = LoadShader(1,&local_128,&local_12c,"triangles_geom.glsl",0x8dd9);
                if (defaultVS != 0) {
                  local_138 = points_frag;
                  local_13c = 0x101d;
                  trianglesGS = LoadShader(1,&local_138,&local_13c,"points_frag.glsl",0x8b30);
                  if (trianglesGS != 0) {
                    local_148 = lines_frag;
                    local_14c = 0x7ff;
                    trianglesFS = LoadShader(1,&local_148,&local_14c,"lines_frag.glsl",0x8b30);
                    if (trianglesFS != 0) {
                      local_158 = triangles_frag;
                      local_15c = 0x74c;
                      defaultFS = LoadShader(1,&local_158,&local_15c,"triangles_frag.glsl",0x8b30);
                      if (defaultFS != 0) {
                        local_168 = default_vert;
                        local_16c = 0x8cf;
                        local_d8 = LoadShader(1,&local_168,&local_16c,"default_vert.glsl",0x8b31);
                        if (local_d8 != 0) {
                          local_178 = default_frag;
                          local_17c = 0x646;
                          local_dc = LoadShader(1,&local_178,&local_17c,"default_frag.glsl",0x8b30);
                          if (local_dc != 0) {
                            GVar1 = (*glad_glCreateProgram)();
                            local_10->program[1] = GVar1;
                            GVar1 = (*glad_glCreateProgram)();
                            local_10->program[2] = GVar1;
                            GVar1 = (*glad_glCreateProgram)();
                            local_10->program[3] = GVar1;
                            GVar1 = (*glad_glCreateProgram)();
                            local_10->program[4] = GVar1;
                            GVar1 = (*glad_glCreateProgram)();
                            local_10->program[5] = GVar1;
                            (*glad_glBindAttribLocation)(local_10->program[1],0,"pos");
                            (*glad_glBindAttribLocation)(local_10->program[2],0,"pos");
                            (*glad_glBindAttribLocation)(local_10->program[3],0,"pos");
                            (*glad_glBindAttribLocation)(local_10->program[4],0,"pos");
                            (*glad_glBindAttribLocation)(local_10->program[5],0,"pos");
                            iVar2 = program_init(local_10,1,3,(ulong)linesGS,(ulong)curveGS,
                                                 (ulong)trianglesGS);
                            if (iVar2 == 0) {
                              (*glad_glDetachShader)(local_10->program[1],linesGS);
                              (*glad_glDetachShader)(local_10->program[1],curveGS);
                              (*glad_glDetachShader)(local_10->program[1],trianglesGS);
                              (*glad_glDeleteShader)(curveGS);
                              (*glad_glDeleteShader)(trianglesGS);
                              iVar2 = program_init(local_10,2,3,(ulong)linesGS,(ulong)pointsFS,
                                                   (ulong)trianglesFS);
                              if (iVar2 == 0) {
                                (*glad_glDetachShader)(local_10->program[2],linesGS);
                                (*glad_glDetachShader)(local_10->program[2],pointsFS);
                                (*glad_glDetachShader)(local_10->program[2],trianglesFS);
                                (*glad_glDeleteShader)(pointsFS);
                                iVar2 = program_init(local_10,3,3,(ulong)linesGS,(ulong)linesFS,
                                                     (ulong)trianglesFS);
                                if (iVar2 == 0) {
                                  (*glad_glDetachShader)(local_10->program[3],linesGS);
                                  (*glad_glDetachShader)(local_10->program[3],linesFS);
                                  (*glad_glDetachShader)(local_10->program[3],trianglesFS);
                                  (*glad_glDeleteShader)(linesFS);
                                  (*glad_glDeleteShader)(trianglesFS);
                                  iVar2 = program_init(local_10,4,3,(ulong)linesGS,(ulong)defaultVS,
                                                       (ulong)defaultFS);
                                  if (iVar2 == 0) {
                                    (*glad_glDetachShader)(local_10->program[4],linesGS);
                                    (*glad_glDetachShader)(local_10->program[4],defaultVS);
                                    (*glad_glDetachShader)(local_10->program[4],defaultFS);
                                    (*glad_glDeleteShader)(linesGS);
                                    (*glad_glDeleteShader)(defaultVS);
                                    (*glad_glDeleteShader)(defaultFS);
                                    iVar2 = program_init(local_10,5,2,(ulong)local_d8,
                                                         (ulong)local_dc);
                                    if (iVar2 == 0) {
                                      (*glad_glDetachShader)(local_10->program[5],local_d8);
                                      (*glad_glDetachShader)(local_10->program[5],local_dc);
                                      (*glad_glDeleteShader)(local_d8);
                                      (*glad_glDeleteShader)(local_dc);
                                      text_rasterizer_init(local_10);
                                      points_rasterizer_init(local_10->program[1]);
                                      points_rasterizer_init(local_10->program[3]);
                                      points_rasterizer_init(local_10->program[4]);
                                      points_rasterizer_init(local_10->program[2]);
                                      points_rasterizer_init(local_10->program[5]);
                                      local_10->last_program = 5;
                                      return;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bov_error_log(0x20002,"check your driver and OpenGL capabilities");
  fprintf(_stderr,"\t(in function %s, line %d)\n","window_OpenGL_init",0x2e5);
  exit(1);
}

Assistant:

static void window_OpenGL_init(bov_window_t* window)
{
#ifndef NDEBUG
	{
		bov_text_param_t t;
		bov_points_param_t p;
		if(sizeof(bov_points_param_t)!=sizeof(bov_text_param_t) ||
		   ((char*) &t.fillColor - (char*) &t) != ((char*) &p.fillColor - (char*) &p) ||
		   ((char*) &t.fillColor - (char*) &t) != 0  ||
		   ((char*) &t.outlineColor - (char*) &t) != ((char*) &p.outlineColor - (char*) &p) ||
		   ((char*) &t.outlineColor - (char*) &t) != 16 ||
		   ((char*) &t.pos - (char*) &t) != ((char*) &p.pos - (char*) &p) ||
		   ((char*) &t.pos - (char*) &t) != 32 ||
		   ((char*) &t.shift - (char*) &t) != ((char*) &p.scale - (char*) &p) ||
		   ((char*) &t.shift - (char*) &t) != 40 ||
		   ((char*) &t.fontSize - (char*) &t) != ((char*) &p.width - (char*) &p) ||
		   ((char*) &t.fontSize - (char*) &t) != 48 ||
		   ((char*) &t.boldness - (char*) &t) != ((char*) &p.marker - (char*) &p) ||
		   ((char*) &t.boldness - (char*) &t) != 52 ||
		   ((char*) &t.outlineWidth - (char*) &t) != ((char*) &p.outlineWidth - (char*) &p) ||
		   ((char*) &t.outlineWidth - (char*) &t) != 56
		  ) {
			BOV_ERROR_LOG(BOV_SHADER_ERROR,
			              "bov_points_param_t and bov_text_param_t must "
			              "have identical fields");
			fprintf(stderr, "%zu\n", (char*) &t.fillColor - (char*) &t);
			fprintf(stderr, "%zu\n", (char*) &t.outlineColor - (char*) &t);
			fprintf(stderr, "%zu\n", (char*) &t.pos - (char*) &t);
			fprintf(stderr, "%zu\n", (char*) &t.shift - (char*) &t);
			fprintf(stderr, "%zu\n", (char*) &t.fontSize - (char*) &t);
			fprintf(stderr, "%zu\n", (char*) &t.boldness - (char*) &t);
			fprintf(stderr, "%zu\n", (char*) &t.outlineWidth - (char*) &t);
			exit(EXIT_FAILURE);
		}
	}
#endif

	// Create draw and object UBO
	glGenBuffers(2, window->ubo);
	glBindBuffer(GL_UNIFORM_BUFFER, window->ubo[0]);
	glBufferData(GL_UNIFORM_BUFFER, sizeof(bov_world_param_t), NULL, GL_STATIC_DRAW);
	glBindBufferRange(GL_UNIFORM_BUFFER, 0, window->ubo[0], 0, sizeof(bov_world_param_t));

	glBindBuffer(GL_UNIFORM_BUFFER, window->ubo[1]);
	glBufferData(GL_UNIFORM_BUFFER, sizeof(bov_points_param_t), NULL, GL_DYNAMIC_DRAW);
	glBindBufferRange(GL_UNIFORM_BUFFER, 1, window->ubo[1], 0, sizeof(bov_points_param_t));
	glBindBuffer(GL_UNIFORM_BUFFER, 0);

	// compile shaders
	{ // text
		GLuint fontVS, fontFS;
		if((fontVS = LoadShader(1,
		                        (const GLchar* []) {text_vert},
		                        (GLint[]){ sizeof(text_vert) - 1 },
		                        "text_vert.glsl",
		                        GL_VERTEX_SHADER))==0)
			goto shader_error;
		if((fontFS = LoadShader(1,
		                        (const GLchar* []) {text_frag},
		                        (GLint[]){ sizeof(text_frag) - 1 },
		                        "text_frag.glsl",
		                        GL_FRAGMENT_SHADER))==0)
			goto shader_error;

		window->program[TEXT_PROGRAM_INDEX] = glCreateProgram();

		// Specify the layout of the vertex data
		glBindAttribLocation(window->program[TEXT_PROGRAM_INDEX],
		                     POS_LOCATION, "pos");
		glBindAttribLocation(window->program[TEXT_PROGRAM_INDEX],
		                     TEX_LOCATION, "tex");

		if(program_init(window, TEXT_PROGRAM_INDEX, 2, fontVS, fontFS))
			goto shader_error;
		glDetachShader(window->program[TEXT_PROGRAM_INDEX],fontVS);
		glDetachShader(window->program[TEXT_PROGRAM_INDEX],fontFS);

		glDeleteShader(fontVS);
		glDeleteShader(fontFS);
	}

	{ // points
		GLuint pointsVS, pointsGS, linesGS, curveGS, pointsFS, linesFS,
		       trianglesGS, trianglesFS, defaultVS, defaultFS;

		if((pointsVS = LoadShader(1,
		                          (const GLchar* []) {points_vert},
		                          (const GLint[]) {sizeof(points_vert) - 1},
		                          "points_vert.glsl",
		                          GL_VERTEX_SHADER))==0)
			goto shader_error;
		if((pointsGS = LoadShader(1,
		                          (const GLchar* []) {points_geom},
		                          (const GLint[]) {sizeof(points_geom) - 1},
		                          "points_geom.glsl",
		                          GL_GEOMETRY_SHADER))==0)
			goto shader_error;
		if((linesGS = LoadShader(1,
		                         (const GLchar* []) {lines_geom},
		                         (const GLint[]) {sizeof(lines_geom) - 1},
		                         "lines_geom.glsl",
		                         GL_GEOMETRY_SHADER))==0)
			goto shader_error;
		if((curveGS = LoadShader(1,
		                         (const GLchar* []) {curve_geom},
		                         (const GLint[]) {sizeof(curve_geom) - 1},
		                         "curve_geom.glsl",
		                         GL_GEOMETRY_SHADER))==0)
			goto shader_error;
		if((trianglesGS = LoadShader(1,
		                             (const GLchar* []) {triangles_geom},
		                             (const GLint[]) {sizeof(triangles_geom) - 1},
		                             "triangles_geom.glsl",
		                             GL_GEOMETRY_SHADER))==0)
			goto shader_error;
		if((pointsFS = LoadShader(1,
		                          (const GLchar* []) {points_frag},
		                          (const GLint[]) {sizeof(points_frag) - 1},
		                          "points_frag.glsl",
		                          GL_FRAGMENT_SHADER))==0)
			goto shader_error;
		if((linesFS = LoadShader(1,
		                         (const GLchar* []) {lines_frag},
		                         (const GLint[]) {sizeof(lines_frag) - 1},
		                         "lines_frag.glsl",
		                         GL_FRAGMENT_SHADER))==0)
			goto shader_error;
		if((trianglesFS = LoadShader(1,
		                             (const GLchar* []) {triangles_frag},
		                             (const GLint[]) {sizeof(triangles_frag) - 1},
		                             "triangles_frag.glsl",
		                             GL_FRAGMENT_SHADER))==0)
			goto shader_error;
		if((defaultVS = LoadShader(1,
		                          (const GLchar* []) {default_vert},
		                          (const GLint[]) {sizeof(default_vert) - 1},
		                          "default_vert.glsl",
		                          GL_VERTEX_SHADER))==0)
			goto shader_error;
		if((defaultFS = LoadShader(1,
		                          (const GLchar* []) {default_frag},
		                          (const GLint[]) {sizeof(default_frag) - 1},
		                          "default_frag.glsl",
		                          GL_FRAGMENT_SHADER))==0)
			goto shader_error;

		window->program[POINTS_PROGRAM_INDEX] = glCreateProgram();
		window->program[LINES_PROGRAM_INDEX] = glCreateProgram();
		window->program[CURVE_PROGRAM_INDEX] = glCreateProgram();
		window->program[TRIANGLES_PROGRAM_INDEX] = glCreateProgram();
		window->program[DEFAULT_PROGRAM_INDEX] = glCreateProgram();

		// Specify the layout of the vertex data
		glBindAttribLocation(window->program[POINTS_PROGRAM_INDEX],
		                     POS_LOCATION, "pos");
		glBindAttribLocation(window->program[LINES_PROGRAM_INDEX],
		                     POS_LOCATION, "pos");
		glBindAttribLocation(window->program[CURVE_PROGRAM_INDEX],
		                     POS_LOCATION, "pos");
		glBindAttribLocation(window->program[TRIANGLES_PROGRAM_INDEX],
		                     POS_LOCATION, "pos");
		glBindAttribLocation(window->program[DEFAULT_PROGRAM_INDEX],
		                     POS_LOCATION, "pos");

		if(program_init(window, POINTS_PROGRAM_INDEX,
		                3, pointsVS, pointsGS, pointsFS))
			goto shader_error;
		glDetachShader(window->program[POINTS_PROGRAM_INDEX], pointsVS);
		glDetachShader(window->program[POINTS_PROGRAM_INDEX], pointsGS);
		glDetachShader(window->program[POINTS_PROGRAM_INDEX], pointsFS);

		glDeleteShader(pointsGS);
		glDeleteShader(pointsFS);

		if(program_init(window, LINES_PROGRAM_INDEX,
		                3, pointsVS, linesGS, linesFS))
			goto shader_error;
		glDetachShader(window->program[LINES_PROGRAM_INDEX], pointsVS);
		glDetachShader(window->program[LINES_PROGRAM_INDEX], linesGS);
		glDetachShader(window->program[LINES_PROGRAM_INDEX], linesFS);

		glDeleteShader(linesGS);

		if(program_init(window, CURVE_PROGRAM_INDEX,
		                3, pointsVS, curveGS, linesFS))
			goto shader_error;
		glDetachShader(window->program[CURVE_PROGRAM_INDEX], pointsVS);
		glDetachShader(window->program[CURVE_PROGRAM_INDEX], curveGS);
		glDetachShader(window->program[CURVE_PROGRAM_INDEX], linesFS);

		glDeleteShader(curveGS);
		glDeleteShader(linesFS);

		if(program_init(window, TRIANGLES_PROGRAM_INDEX,
		                3, pointsVS, trianglesGS, trianglesFS))
			goto shader_error;
		glDetachShader(window->program[TRIANGLES_PROGRAM_INDEX], pointsVS);
		glDetachShader(window->program[TRIANGLES_PROGRAM_INDEX], trianglesGS);
		glDetachShader(window->program[TRIANGLES_PROGRAM_INDEX], trianglesFS);

		glDeleteShader(pointsVS);
		glDeleteShader(trianglesGS);
		glDeleteShader(trianglesFS);

		if(program_init(window, DEFAULT_PROGRAM_INDEX,
		                2, defaultVS, defaultFS))
			goto shader_error;

		glDetachShader(window->program[DEFAULT_PROGRAM_INDEX], defaultVS);
		glDetachShader(window->program[DEFAULT_PROGRAM_INDEX], defaultFS);

		glDeleteShader(defaultVS);
		glDeleteShader(defaultFS);
	}

	// Create all rasterizers
	text_rasterizer_init(window);
	points_rasterizer_init(window->program[POINTS_PROGRAM_INDEX]);
	points_rasterizer_init(window->program[CURVE_PROGRAM_INDEX]);
	points_rasterizer_init(window->program[TRIANGLES_PROGRAM_INDEX]);
	points_rasterizer_init(window->program[LINES_PROGRAM_INDEX]);

	points_rasterizer_init(window->program[DEFAULT_PROGRAM_INDEX]);
	window->last_program = DEFAULT_PROGRAM_INDEX;

	return;

shader_error:
	BOV_ERROR_LOG(BOV_SHADER_ERROR,
	              "check your driver and OpenGL capabilities");
	exit(EXIT_FAILURE);
}